

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O3

int normal_scanRef(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  XML_Convert_Result XVar4;
  ulong uVar5;
  char **ppcVar6;
  long lVar7;
  unsigned_short **ppuVar8;
  char *pcVar9;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  int iVar10;
  int iVar11;
  unsigned_short *in_R8;
  char **ppcVar12;
  
  ppcVar6 = (char **)(end + -(long)ptr);
  if ((long)ppcVar6 < 1) {
    return -1;
  }
  bVar1 = *(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  pcVar9 = (char *)(ulong)bVar1;
  iVar10 = 0;
  ppcVar12 = (char **)ptr;
  iVar11 = iVar10;
  if (bVar1 < 0x13) {
    if (bVar1 == 5) {
      if (ppcVar6 == (char **)0x1) {
        return -2;
      }
      iVar3 = (*enc[3].literalScanners[0])(enc,ptr,pcVar9,ppcVar6);
      if (iVar3 == 0) {
        XVar4 = (*enc[3].scanners[1])(enc,ptr,extraout_RDX_00,ppcVar6);
        goto LAB_0017791c;
      }
    }
    else if (bVar1 == 6) {
      if (ppcVar6 < (char **)0x3) {
        return -2;
      }
      iVar3 = (*enc[3].literalScanners[1])(enc,ptr,pcVar9,ppcVar6);
      if (iVar3 == 0) {
        XVar4 = (*enc[3].scanners[2])(enc,ptr,extraout_RDX_01,ppcVar6);
        goto LAB_001778f1;
      }
    }
    else {
      iVar11 = 0;
      if (bVar1 == 7) {
        if (ppcVar6 < (char **)0x4) {
          return -2;
        }
        iVar3 = (*enc[3].nameMatchesAscii)(enc,ptr,pcVar9,(char *)ppcVar6);
        iVar11 = iVar10;
        if (iVar3 == 0) {
          XVar4 = (*enc[3].scanners[3])(enc,ptr,extraout_RDX,ppcVar6);
          while( true ) {
            lVar7 = 4;
            while( true ) {
              while( true ) {
                ppcVar12 = (char **)ptr;
                iVar11 = iVar10;
                if (XVar4 == XML_CONVERT_COMPLETED) goto LAB_00177929;
LAB_00177841:
                while( true ) {
                  ptr = (char *)((long)ptr + lVar7);
                  uVar5 = (long)end - (long)ptr;
                  if ((long)uVar5 < 1) {
                    return -1;
                  }
                  ppuVar8 = (unsigned_short **)(ulong)(byte)*ptr;
                  bVar1 = *(byte *)((long)enc[1].scanners + (long)ppuVar8);
                  pcVar9 = (char *)(ulong)bVar1;
                  ppcVar12 = (char **)ptr;
                  if (bVar1 < 0x12) break;
                  lVar7 = 1;
                  if ((3 < bVar1 - 0x18) && (bVar1 != 0x16)) {
                    iVar11 = iVar10;
                    if (bVar1 == 0x12) {
                      ppcVar12 = (char **)((long)ptr + 1);
                      iVar11 = 9;
                    }
                    goto LAB_00177929;
                  }
                }
                if (bVar1 != 5) break;
                if (uVar5 == 1) {
                  return -2;
                }
                iVar3 = (*enc[3].literalScanners[0])(enc,ptr,pcVar9,(char **)ppuVar8);
                iVar11 = iVar10;
                if (iVar3 != 0) goto LAB_00177929;
                XVar4 = (*enc[2].utf16Convert)(enc,(char **)ptr,extraout_RDX_03,ppuVar8,in_R8);
LAB_0017791c:
                lVar7 = 2;
              }
              if (bVar1 != 6) break;
              if (uVar5 < 3) {
                return -2;
              }
              iVar3 = (*enc[3].literalScanners[1])(enc,ptr,pcVar9,(char **)ppuVar8);
              iVar11 = iVar10;
              if (iVar3 != 0) goto LAB_00177929;
              XVar4 = (**(code **)&enc[2].minBytesPerChar)(enc,ptr);
LAB_001778f1:
              lVar7 = 3;
            }
            iVar11 = iVar10;
            if (bVar1 != 7) break;
            if (uVar5 < 4) {
              return -2;
            }
            iVar3 = (*enc[3].nameMatchesAscii)(enc,ptr,pcVar9,(char *)ppuVar8);
            if (iVar3 != 0) break;
            XVar4 = (*enc[3].scanners[0])(enc,ptr,extraout_RDX_02,(char **)ppuVar8);
          }
        }
      }
    }
  }
  else if (bVar1 == 0x13) {
    ppcVar12 = (char **)(ptr + 1);
    if ((char **)end == ppcVar12 || (long)end - (long)ppcVar12 < 0) {
      return -1;
    }
    if ((ulong)*(byte *)ppcVar12 == 0x78) {
      ppcVar12 = (char **)(ptr + 2);
      if ((char **)end == ppcVar12 || (long)end - (long)ppcVar12 < 0) {
        return -1;
      }
      if ((*(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar12) & 0xfe) != 0x18)
      goto LAB_00177929;
      ppcVar12 = (char **)(ptr + 3);
      lVar7 = (long)end - (long)ppcVar12;
      while( true ) {
        if (lVar7 < 1) {
          return -1;
        }
        bVar1 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar12);
        if (1 < bVar1 - 0x18) break;
        ppcVar12 = (char **)((long)ppcVar12 + 1);
        lVar7 = lVar7 + -1;
      }
      if (bVar1 != 0x12) goto LAB_00177929;
      ppcVar6 = (char **)((long)ppcVar12 + 1);
    }
    else {
      if (*(char *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar12) != '\x19') goto LAB_00177929;
      lVar7 = (long)ppcVar6 + -2;
      ppcVar6 = (char **)(ptr + 2);
      do {
        ppcVar12 = ppcVar6;
        if (lVar7 < 1) {
          return -1;
        }
        cVar2 = *(char *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar12);
        ppcVar6 = (char **)((long)ppcVar12 + 1);
        lVar7 = lVar7 + -1;
      } while (cVar2 == '\x19');
      if (cVar2 != '\x12') goto LAB_00177929;
    }
    ppcVar12 = ppcVar6;
    iVar11 = 10;
  }
  else {
    lVar7 = 1;
    if (bVar1 == 0x16) goto LAB_00177841;
    if (bVar1 == 0x18) goto LAB_00177841;
  }
LAB_00177929:
  *nextTokPtr = (char *)ppcVar12;
  return iVar11;
}

Assistant:

static int PTRCALL
PREFIX(scanRef)(const ENCODING *enc, const char *ptr, const char *end,
                const char **nextTokPtr) {
  REQUIRE_CHAR(enc, ptr, end);
  switch (BYTE_TYPE(enc, ptr)) {
    CHECK_NMSTRT_CASES(enc, ptr, end, nextTokPtr)
  case BT_NUM:
    return PREFIX(scanCharRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  default:
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  }
  while (HAS_CHAR(enc, ptr, end)) {
    switch (BYTE_TYPE(enc, ptr)) {
      CHECK_NAME_CASES(enc, ptr, end, nextTokPtr)
    case BT_SEMI:
      *nextTokPtr = ptr + MINBPC(enc);
      return XML_TOK_ENTITY_REF;
    default:
      *nextTokPtr = ptr;
      return XML_TOK_INVALID;
    }
  }
  return XML_TOK_PARTIAL;
}